

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadResourcesTest<vkt::api::(anonymous_namespace)::Buffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  deUint32 dVar1;
  Resources *pRVar2;
  reference pvVar3;
  CreateThread<vkt::api::(anonymous_namespace)::Buffer> *this_00;
  DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread> local_f1;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_f0;
  SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources> local_e0;
  uint local_cc;
  undefined1 local_c8 [4];
  deUint32 ndx;
  ThreadGroup threads;
  allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_> local_81;
  undefined1 local_80 [8];
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
  resources;
  Environment env;
  deUint32 numThreads;
  Context *context_local;
  Parameters params_local;
  
  params_local.size._0_4_ = (undefined4)params.size;
  context_local = context;
  params_local._8_8_ = __return_storage_ptr__;
  dVar1 = getDefaultTestThreadCount();
  Environment::Environment
            ((Environment *)
             &resources.
              super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Context *)this,1);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>::allocator
            (&local_81);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
  ::vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
            *)local_80,(ulong)dVar1,&local_81);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>::~allocator
            (&local_81);
  ThreadGroup::ThreadGroup((ThreadGroup *)local_c8);
  for (local_cc = 0; local_cc < dVar1; local_cc = local_cc + 1) {
    pRVar2 = (Resources *)operator_new(1);
    Buffer::Resources::Resources
              (pRVar2,(Environment *)
                      &resources.
                       super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (Parameters *)&context_local);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>::SharedPtr(&local_e0,pRVar2);
    pvVar3 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
                           *)local_80,(ulong)local_cc);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>::operator=(pvVar3,&local_e0);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>::~SharedPtr(&local_e0);
    this_00 = (CreateThread<vkt::api::(anonymous_namespace)::Buffer> *)operator_new(0x88);
    pvVar3 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
                           *)local_80,(ulong)local_cc);
    pRVar2 = de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>::operator*(pvVar3);
    CreateThread<vkt::api::(anonymous_namespace)::Buffer>::CreateThread
              (this_00,(Environment *)
                       &resources.
                        super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pRVar2,
               (Parameters *)&context_local);
    de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>::DefaultDeleter
              (&local_f1);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::MovePtr(&local_f0,this_00);
    ThreadGroup::add((ThreadGroup *)local_c8,&local_f0);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::~MovePtr(&local_f0);
  }
  ThreadGroup::run(__return_storage_ptr__,(ThreadGroup *)local_c8);
  ThreadGroup::~ThreadGroup((ThreadGroup *)local_c8);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
  ::~vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
             *)local_80);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadResourcesTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32		numThreads	= getDefaultTestThreadCount();
	const Environment	env			(context, 1u);
	vector<ResPtr>		resources	(numThreads);
	ThreadGroup			threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		resources[ndx] = ResPtr(new typename Object::Resources(env, params));
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, *resources[ndx], params)));
	}

	return threads.run();
}